

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

void get_comm(char **pt,char *kcomm,unsigned_long *stat)

{
  char *__src;
  int iVar1;
  ushort **ppuVar2;
  ulong *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *p;
  int nchar;
  char *pi;
  char *local_30;
  
  __src = (char *)*in_RDI;
  local_30 = __src;
  if (*__src != '/') {
    *in_RDX = *in_RDX | 0x400;
  }
  while (local_30 = local_30 + 1, *local_30 != '\0') {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*local_30] & 0x4000) == 0) {
      *in_RDX = *in_RDX | 0x800;
    }
  }
  iVar1 = (int)local_30 - (int)__src;
  strncpy(in_RSI,__src,(long)iVar1);
  in_RSI[iVar1] = '\0';
  return;
}

Assistant:

void get_comm(char **pt,     		/* card string */
	    char *kcomm,		/* comment string */
	    unsigned long *stat		/* error number */
	   )
{        
    char *pi;
    int nchar = 0;
    char *p; 

    p = *pt;
    pi = p;
    if(*p != '/')  { 
      *stat |= NO_START_SLASH; 
    }
    p++;
    while(*p != '\0') {
        if(!isprint((int)*p) ) *stat |=  BAD_COMMENT;
        p++;
    }
    nchar = p - pi; 
    strncpy(kcomm,pi,nchar);
    *(kcomm+nchar) = '\0';
    return;
}